

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthreads_summator_lib.cpp
# Opt level: O1

longlong more_pthr(void)

{
  int *piVar1;
  int *__arg;
  long lVar2;
  pthread_t *__newthread;
  long lVar3;
  pthread_t threads [10];
  undefined1 auStack_80 [8];
  pthread_t local_78 [10];
  
  __newthread = local_78;
  auStack_80 = (undefined1  [8])0x102984;
  piVar1 = (int *)operator_new__(0xa0);
  lVar2 = -10;
  __arg = piVar1;
  do {
    *__arg = (int)lVar2 + 0xb;
    __arg[2] = 0;
    __arg[3] = 0;
    auStack_80 = (undefined1  [8])0x1029bc;
    pthread_create(__newthread,(pthread_attr_t *)0x0,thread,__arg);
    __newthread = __newthread + 1;
    __arg = __arg + 4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  lVar3 = 4;
  lVar2 = 0;
  do {
    auStack_80 = (undefined1  [8])0x1029de;
    pthread_join(*(pthread_t *)((long)local_78 + lVar3 + -4),(void **)0x0);
    lVar2 = lVar2 + *(long *)((long)piVar1 + lVar3 * 2);
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x54);
  auStack_80 = (undefined1  [8])0x1029f1;
  clock();
  auStack_80 = (undefined1  [8])0x1029f9;
  operator_delete__(piVar1);
  return lVar2;
}

Assistant:

long long more_pthr() {
    pthread_t threads[N];
    thr_data* threadData = new thr_data[N];
    long long all_sum = 0;
    for(int i = 0; i < N; i++){
        threadData[i].numberFile = i + 1;
        threadData[i].sum = 0;
        pthread_create(&(threads[i]), NULL, thread, &threadData[i]);
    }
    for(int i = 0; i < N; i++){
        pthread_join(threads[i], NULL);
        all_sum+=threadData[i].sum;
    }
    unsigned int time_end = clock();
    delete[] threadData;
    return all_sum;
}